

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto_storage.c
# Opt level: O0

psa_status_t psa_crypto_storage_store(psa_key_file_id_t key,uint8_t *data,size_t data_length)

{
  int iVar1;
  psa_status_t pVar2;
  psa_storage_info_t local_38;
  psa_storage_info_t data_identifier_info;
  psa_storage_uid_t data_identifier;
  psa_status_t status;
  size_t data_length_local;
  uint8_t *data_local;
  psa_key_file_id_t key_local;
  
  data_identifier_info = (psa_storage_info_t)psa_its_identifier_of_slot(key);
  iVar1 = psa_is_key_present_in_storage(key);
  if (iVar1 == 1) {
    data_local._4_4_ = -0x8b;
  }
  else {
    pVar2 = psa_its_set((psa_storage_uid_t)data_identifier_info,(uint32_t)data_length,data,0);
    if (pVar2 == 0) {
      data_identifier._4_4_ = psa_its_get_info((psa_storage_uid_t)data_identifier_info,&local_38);
      if ((data_identifier._4_4_ == 0) && (local_38.size != data_length)) {
        data_identifier._4_4_ = -0x92;
      }
      if (data_identifier._4_4_ != 0) {
        psa_its_remove((psa_storage_uid_t)data_identifier_info);
      }
      data_local._4_4_ = data_identifier._4_4_;
    }
    else {
      data_local._4_4_ = -0x92;
    }
  }
  return data_local._4_4_;
}

Assistant:

static psa_status_t psa_crypto_storage_store( const psa_key_file_id_t key,
                                              const uint8_t *data,
                                              size_t data_length )
{
    psa_status_t status;
    psa_storage_uid_t data_identifier = psa_its_identifier_of_slot( key );
    struct psa_storage_info_t data_identifier_info;

    if( psa_is_key_present_in_storage( key ) == 1 )
        return( PSA_ERROR_ALREADY_EXISTS );

    status = psa_its_set( data_identifier, (uint32_t) data_length, data, 0 );
    if( status != PSA_SUCCESS )
    {
        return( PSA_ERROR_STORAGE_FAILURE );
    }

    status = psa_its_get_info( data_identifier, &data_identifier_info );
    if( status != PSA_SUCCESS )
    {
        goto exit;
    }

    if( data_identifier_info.size != data_length )
    {
        status = PSA_ERROR_STORAGE_FAILURE;
        goto exit;
    }

exit:
    if( status != PSA_SUCCESS )
        psa_its_remove( data_identifier );
    return( status );
}